

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::createInstance
          (BeagleCPUImpl<double,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  double **ppdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  EigenDecompositionSquare<double,_1> *this_00;
  double **ppdVar6;
  double *pdVar7;
  int **ppiVar8;
  long lVar9;
  undefined8 *puVar10;
  double *pdVar11;
  void *pvVar12;
  int *piVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int i_1;
  ulong uVar17;
  int i;
  uint uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  uint local_38;
  
  this->realtypeMin = 2.2250738585072014e-308;
  this->scalingExponentThreshold = 200;
  *(int *)&(this->super_BeagleImpl).field_0xc = partialsBufferCount + compactBufferCount;
  this->kTipCount = tipCount;
  this->kStateCount = stateCount;
  this->kPatternCount = patternCount;
  this->kPartitionCount = 1;
  this->kMaxPartitionCount = 1;
  this->kPartitionsInitialised = false;
  this->kPatternsReordered = false;
  this->kInternalPartialsBufferCount = (partialsBufferCount + compactBufferCount) - tipCount;
  this->kTransPaddedStateCount = stateCount + 1;
  this->kPartialsPaddedStateCount = stateCount;
  iVar3 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5c])();
  iVar4 = this->kStateCount;
  iVar14 = this->kPatternCount % iVar3;
  iVar3 = iVar3 - iVar14;
  if (iVar14 == 0) {
    iVar3 = 0;
  }
  uVar19 = requirementFlags | preferenceFlags;
  uVar15 = this->kPatternCount + iVar3;
  this->kPaddedPatternCount = uVar15;
  this->kExtraPatterns = iVar3;
  this->kMatrixCount = matrixCount;
  this->kEigenDecompCount = eigenDecompositionCount;
  this->kCategoryCount = categoryCount;
  this->kScaleBufferCount = scaleBufferCount;
  this->kMatrixSize = (iVar4 + 1) * iVar4;
  this->kFlags = 0;
  uVar18 = (uint)uVar19;
  if ((char)uVar19 < '\0') {
    this->kFlags = 0x480;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount;
    lVar5 = 0x480;
  }
  else if ((uVar18 >> 8 & 1) == 0) {
    if ((uVar18 >> 0x19 & 1) == 0) {
      if ((uVar18 >> 10 & 1) == 0) {
        lVar5 = 0x240;
        this->kFlags = 0x240;
      }
      else {
        this->kFlags = 0x440;
        lVar5 = 0x440;
      }
    }
    else {
      this->kFlags = 0x2000200;
      lVar5 = 0x2000200;
    }
  }
  else {
    this->kFlags = 0x500;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount + 1;
    lVar5 = 0x500;
  }
  uVar16 = 0x40000000;
  if ((uVar18 >> 0x1e & 1) == 0) {
    uVar16 = 0x4000;
  }
  lVar5 = (ulong)(((uVar18 & 0x20) >> 5) << 4) + lVar5 + 0x100010 +
          (uVar16 | (uint)(uVar19 >> 1) & 0x100000);
  this->kFlags = lVar5;
  if ((uVar19 & 0x20) == 0) {
    this_00 = (EigenDecompositionSquare<double,_1> *)operator_new(0x48);
    EigenDecompositionCube<double,_1>::EigenDecompositionCube
              ((EigenDecompositionCube<double,_1> *)this_00,eigenDecompositionCount,iVar4,
               categoryCount,lVar5);
  }
  else {
    this_00 = (EigenDecompositionSquare<double,_1> *)operator_new(0x58);
    EigenDecompositionSquare<double,_1>::EigenDecompositionSquare
              (this_00,eigenDecompositionCount,iVar4,categoryCount,lVar5);
  }
  this->gEigenDecomposition = &this_00->super_EigenDecomposition<double,_1>;
  sVar20 = (size_t)this->kEigenDecompCount;
  ppdVar6 = (double **)calloc(8,sVar20);
  this->gCategoryRates = ppdVar6;
  if (ppdVar6 != (double **)0x0) {
    pdVar7 = (double *)malloc((long)this->kPatternCount << 3);
    this->gPatternWeights = pdVar7;
    if (pdVar7 != (double *)0x0) {
      this->kPartialsSize =
           this->kPartialsPaddedStateCount * this->kPaddedPatternCount * this->kCategoryCount;
      uVar18 = *(uint *)&(this->super_BeagleImpl).field_0xc;
      ppdVar6 = (double **)malloc((long)(int)uVar18 * 8);
      this->gPartials = ppdVar6;
      if (ppdVar6 != (double **)0x0) {
        ppdVar6 = (double **)calloc(8,sVar20);
        this->gStateFrequencies = ppdVar6;
        if (ppdVar6 != (double **)0x0) {
          ppdVar6 = (double **)calloc(8,sVar20);
          this->gCategoryWeights = ppdVar6;
          if (ppdVar6 != (double **)0x0) {
            ppiVar8 = (int **)malloc((long)(int)uVar18 * 8);
            this->gTipStates = ppiVar8;
            if (ppiVar8 != (int **)0x0) {
              for (uVar19 = 0; (~((int)uVar18 >> 0x1f) & uVar18) != uVar19; uVar19 = uVar19 + 1) {
                this->gPartials[uVar19] = (double *)0x0;
                this->gTipStates[uVar19] = (int *)0x0;
              }
              lVar5 = (long)this->kTipCount;
              do {
                if (*(int *)&(this->super_BeagleImpl).field_0xc <= lVar5) {
                  this->gScaleBuffers = (double **)0x0;
                  this->gAutoScaleBuffers = (short **)0x0;
                  uVar18 = this->kScaleBufferCount;
                  lVar5 = this->kFlags;
                  ppdVar6 = (double **)malloc((long)(int)uVar18 * 8);
                  lVar9 = (long)(int)uVar15;
                  if ((char)lVar5 < '\0') {
                    this->gAutoScaleBuffers = (short **)ppdVar6;
                    if (ppdVar6 != (double **)0x0) {
                      uVar19 = 0;
                      goto LAB_0012b816;
                    }
                  }
                  else {
                    this->gScaleBuffers = ppdVar6;
                    if (ppdVar6 != (double **)0x0) {
                      uVar19 = 0;
                      goto LAB_0012b7a8;
                    }
                  }
                  break;
                }
                pdVar7 = (double *)mallocAligned(this,(long)this->kPartialsSize << 3);
                this->gPartials[lVar5] = pdVar7;
                ppdVar6 = this->gPartials + lVar5;
                lVar5 = lVar5 + 1;
              } while (*ppdVar6 != (double *)0x0);
            }
          }
        }
      }
    }
  }
  goto LAB_0012b8cf;
LAB_0012b7a8:
  if (uVar19 == (~((int)uVar18 >> 0x1f) & uVar18)) goto LAB_0012b875;
  pdVar7 = (double *)malloc(lVar9 << 3);
  ppdVar6[uVar19] = pdVar7;
  ppdVar6 = this->gScaleBuffers;
  pdVar7 = ppdVar6[uVar19];
  if (pdVar7 == (double *)0x0) goto LAB_0012b8cf;
  local_38 = (uint)lVar5;
  if ((local_38 >> 0x19 & 1) != 0) {
    for (uVar16 = 0; (~((int)uVar15 >> 0x1f) & uVar15) != uVar16; uVar16 = uVar16 + 1) {
      pdVar7[uVar16] = 1.0;
    }
  }
  uVar19 = uVar19 + 1;
  goto LAB_0012b7a8;
  while( true ) {
    pdVar7 = (double *)malloc(lVar9 * 2);
    ppdVar6[uVar19] = pdVar7;
    ppdVar6 = (double **)this->gAutoScaleBuffers;
    ppdVar1 = ppdVar6 + uVar19;
    uVar19 = uVar19 + 1;
    if (*ppdVar1 == (double *)0x0) break;
LAB_0012b816:
    if ((~((int)uVar18 >> 0x1f) & uVar18) == uVar19) {
      piVar13 = (int *)malloc((long)this->kInternalPartialsBufferCount << 2);
      this->gActiveScalingFactors = piVar13;
      ppdVar6 = (double **)malloc(8);
      this->gScaleBuffers = ppdVar6;
      pdVar7 = (double *)malloc(lVar9 << 3);
      *ppdVar6 = pdVar7;
LAB_0012b875:
      ppdVar6 = (double **)malloc((long)this->kMatrixCount << 3);
      this->gTransitionMatrices = ppdVar6;
      if (ppdVar6 != (double **)0x0) {
        lVar5 = 0;
        do {
          if (this->kMatrixCount <= lVar5) {
            pdVar7 = (double *)
                     mallocAligned(this,(long)this->kStateCount * (long)this->kPatternCount * 8);
            this->integrationTmp = pdVar7;
            sVar20 = (long)this->kStateCount * (long)this->kPatternCount * 8;
            pdVar7 = (double *)malloc(sVar20);
            this->firstDerivTmp = pdVar7;
            pdVar7 = (double *)malloc(sVar20);
            this->secondDerivTmp = pdVar7;
            pdVar7 = (double *)mallocAligned(this,(long)this->kPaddedPatternCount << 3);
            this->grandDenominatorDerivTmp = pdVar7;
            pdVar7 = (double *)mallocAligned(this,(long)this->kPaddedPatternCount << 3);
            this->grandNumeratorDerivTmp = pdVar7;
            this->crossProductNumeratorTmp = (double *)0x0;
            sVar20 = (long)this->kStateCount * (long)this->kPatternCount * 8;
            pdVar7 = (double *)malloc(sVar20);
            this->outLogLikelihoodsTmp = pdVar7;
            pdVar7 = (double *)malloc(sVar20);
            this->outFirstDerivativesTmp = pdVar7;
            pdVar7 = (double *)malloc(sVar20);
            this->outSecondDerivativesTmp = pdVar7;
            uVar15 = this->kPaddedPatternCount;
            pdVar7 = (double *)malloc((long)(int)uVar15 << 3);
            this->zeros = pdVar7;
            pdVar11 = (double *)malloc((long)(int)uVar15 << 3);
            this->ones = pdVar11;
            for (uVar19 = 0; (~((int)uVar15 >> 0x1f) & uVar15) != uVar19; uVar19 = uVar19 + 1) {
              pdVar7[uVar19] = 0.0;
              pdVar11[uVar19] = 1.0;
            }
            this->kThreadingEnabled = false;
            this->kAutoPartitioningEnabled = false;
            if ((this->kFlags & 0x40000000) != 0) {
              uVar15 = std::thread::hardware_concurrency();
              if (this->kStateCount < 5) {
                this->kMinPatternCount = 0x100;
                if ((int)uVar15 < 0x10) {
                  this->kMinPatternCount = 0x300;
                  uVar18 = 0x300;
                }
                else {
                  if (this->kPatternCount < 0x40000) {
                    uVar15 = 0x10;
                  }
                  uVar18 = 0x100;
                }
              }
              else {
                this->kMinPatternCount = 2;
                uVar18 = 2;
              }
              uVar2 = this->kPatternCount;
              uVar19 = (ulong)uVar2;
              if (2 < (int)uVar15 && (int)uVar18 <= (int)uVar2) {
                uVar17 = 0;
                uVar16 = (ulong)uVar2 / (ulong)(uVar18 >> 1);
                uVar21 = (ulong)(uVar15 >> 1);
                if ((uint)uVar16 < uVar15 >> 1) {
                  uVar21 = uVar16;
                }
                pvVar12 = malloc(uVar19 * 4);
                for (; uVar19 != uVar17; uVar17 = uVar17 + 1) {
                  iVar4 = (int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                      uVar17 & 0xffffffff) / (long)(int)(uVar19 / uVar21));
                  if ((int)uVar21 <= iVar4) {
                    iVar4 = (int)uVar21 + -1;
                  }
                  *(int *)((long)pvVar12 + uVar17 * 4) = iVar4;
                }
                (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,uVar21,pvVar12);
                piVar13 = (int *)malloc((long)this->kPartitionCount *
                                        (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24);
                this->gAutoPartitionOperations = piVar13;
                if (this->kMinPatternCount * 4 <= this->kPatternCount) {
                  piVar13 = (int *)malloc(uVar21 * 4);
                  this->gAutoPartitionIndices = piVar13;
                  for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
                    piVar13[uVar19] = (int)uVar19;
                  }
                  pdVar7 = (double *)malloc(uVar21 << 3);
                  this->gAutoPartitionOutSumLogLikelihoods = pdVar7;
                  this->kAutoRootPartitioningEnabled = false;
                }
                this->kAutoPartitioningEnabled = false;
              }
            }
            return 0;
          }
          pdVar7 = (double *)
                   mallocAligned(this,(long)this->kCategoryCount * (long)this->kMatrixSize * 8);
          this->gTransitionMatrices[lVar5] = pdVar7;
          ppdVar6 = this->gTransitionMatrices + lVar5;
          lVar5 = lVar5 + 1;
        } while (*ppdVar6 != (double *)0x0);
      }
      break;
    }
  }
LAB_0012b8cf:
  puVar10 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar10 = __cxa_init_primary_exception;
  __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}